

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

void prvTidyWriteChar(uint c,StreamOut *out)

{
  char cVar1;
  Bool BVar2;
  TidyPutByteFunc UNRECOVERED_JUMPTABLE_00;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  byte bVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uint theChars [2];
  int count;
  
  if (c == 10) {
    if (out->nl == 2) {
      c = 0xd;
    }
    else {
      c = 10;
      if (out->nl == 1) {
        prvTidyWriteChar(0xd,out);
      }
    }
  }
  switch(out->encoding) {
  case 2:
    if (c == 0x152) {
      c = 0xbc;
    }
    else if (c == 0x153) {
      c = 0xbd;
    }
    else if (c == 0x160) {
      c = 0xa6;
    }
    else if (c == 0x161) {
      c = 0xa8;
    }
    else if (c == 0x178) {
      c = 0xbe;
    }
    else if (c == 0x17d) {
      c = 0xb4;
    }
    else if (c == 0x17e) {
      c = 0xb8;
    }
    else if (c == 0x20ac) {
      c = 0xa4;
    }
    break;
  case 4:
    count = 0;
    prvTidyEncodeCharToUTF8Bytes(c,(tmbstr)0x0,&out->sink,&count);
    if (0 < count) {
      return;
    }
    (*(out->sink).putByte)((out->sink).sinkData,0xef);
    (*(out->sink).putByte)((out->sink).sinkData,0xbf);
    (*(out->sink).putByte)((out->sink).sinkData,0xbf);
    return;
  case 5:
    if (c == 0x1b) {
      out->state = FSM_ESC;
      c = 0x1b;
    }
    else {
      switch(out->state) {
      case FSM_ESC:
        if (c == 0x28) {
          out->state = FSM_ESCP;
LAB_0013205f:
          c = 0x28;
        }
        else {
          if (c != 0x24) goto switchD_00131f89_caseD_4;
          out->state = FSM_ESCD;
          c = 0x24;
        }
        break;
      case FSM_ESCD:
        if (c == 0x28) {
          out->state = FSM_ESCDP;
          goto LAB_0013205f;
        }
      case FSM_ESCDP:
        out->state = FSM_NONASCII;
        break;
      case FSM_ESCP:
switchD_00131f89_caseD_4:
        out->state = FSM_ASCII;
        break;
      case FSM_NONASCII:
        c = c & 0x7f;
      }
    }
    break;
  case 6:
    if (0x7f < c) {
      puVar3 = Mac2Unicode;
      lVar4 = 0x80;
      while( true ) {
        cVar1 = (char)lVar4;
        bVar10 = lVar4 == 0;
        lVar4 = lVar4 + -1;
        if (bVar10) {
          return;
        }
        if (*puVar3 == c) break;
        puVar3 = puVar3 + 1;
      }
LAB_00131fab:
      pvVar7 = (out->sink).sinkData;
      UNRECOVERED_JUMPTABLE_00 = (out->sink).putByte;
      bVar6 = -cVar1;
LAB_00131fc9:
      (*UNRECOVERED_JUMPTABLE_00)(pvVar7,bVar6);
      return;
    }
    break;
  case 7:
    if (0x5f < c - 0xa0 && 0x7f < c) {
      bVar6 = 0x80;
      lVar4 = 0;
      while( true ) {
        if (lVar4 == 0x80) {
          return;
        }
        if (*(uint *)((long)Win2Unicode + lVar4) == c) break;
        bVar6 = bVar6 + '\x01';
        lVar4 = lVar4 + 4;
      }
      pvVar7 = (out->sink).sinkData;
      UNRECOVERED_JUMPTABLE_00 = (out->sink).putByte;
      goto LAB_00131fc9;
    }
    break;
  case 8:
    if (0x7f < c) {
      puVar3 = IBM2Unicode;
      lVar4 = 0x80;
      while( true ) {
        cVar1 = (char)lVar4;
        bVar10 = lVar4 == 0;
        lVar4 = lVar4 + -1;
        if (bVar10) {
          return;
        }
        if (*puVar3 == c) break;
        puVar3 = puVar3 + 1;
      }
      goto LAB_00131fab;
    }
    break;
  case 9:
  case 10:
  case 0xb:
    BVar2 = prvTidyIsValidUTF16FromUCS4(c);
    if (BVar2 == no) {
      uVar8 = 0;
    }
    else {
      BVar2 = prvTidyIsCombinedChar(c);
      if (BVar2 == no) {
        theChars[0] = c;
        uVar8 = 1;
      }
      else {
        BVar2 = prvTidySplitSurrogatePair(c,theChars,theChars + 1);
        uVar8 = (ulong)((uint)(BVar2 != no) * 2);
      }
    }
    uVar9 = 0;
    do {
      if (uVar8 == uVar9) {
        return;
      }
      uVar5 = theChars[uVar9];
      if (out->encoding - 10U < 2) {
        (*(out->sink).putByte)((out->sink).sinkData,(byte)(uVar5 >> 8));
LAB_00131f59:
        (*(out->sink).putByte)((out->sink).sinkData,(byte)uVar5);
      }
      else if (out->encoding == 9) {
        (*(out->sink).putByte)((out->sink).sinkData,(byte)uVar5);
        uVar5 = uVar5 >> 8;
        goto LAB_00131f59;
      }
      uVar9 = uVar9 + 1;
    } while( true );
  case 0xc:
  case 0xd:
    if (0x7f < c) {
      (*(out->sink).putByte)((out->sink).sinkData,(byte)(c >> 8));
      pvVar7 = (out->sink).sinkData;
      UNRECOVERED_JUMPTABLE_00 = (out->sink).putByte;
      bVar6 = (byte)c;
      goto LAB_00131eac;
    }
  }
  pvVar7 = (out->sink).sinkData;
  UNRECOVERED_JUMPTABLE_00 = (out->sink).putByte;
  bVar6 = (byte)c;
LAB_00131eac:
  (*UNRECOVERED_JUMPTABLE_00)(pvVar7,bVar6);
  return;
}

Assistant:

void TY_(WriteChar)( uint c, StreamOut* out )
{
    /* Translate outgoing newlines */
    if ( LF == c )
    {
      if ( out->nl == TidyCRLF )
          TY_(WriteChar)( CR, out );
      else if ( out->nl == TidyCR )
          c = CR;
    }

    if (out->encoding == MACROMAN)
    {
        EncodeMacRoman( c, out );
    }
    else if (out->encoding == WIN1252)
    {
        EncodeWin1252( c, out );
    }
    else if (out->encoding == IBM858)
    {
        EncodeIbm858( c, out );
    }
    else if (out->encoding == LATIN0)
    {
        EncodeLatin0( c, out );
    }

    else if (out->encoding == UTF8)
    {
        int count = 0;
        
        TY_(EncodeCharToUTF8Bytes)( c, NULL, &out->sink, &count );
        if (count <= 0)
        {
            /* replacement char 0xFFFD encoded as UTF-8 */
            PutByte(0xEF, out); PutByte(0xBF, out); PutByte(0xBF, out);
        }
    }
#ifndef NO_NATIVE_ISO2022_SUPPORT
    else if (out->encoding == ISO2022)
    {
        if (c == 0x1b)  /* ESC */
            out->state = FSM_ESC;
        else
        {
            switch (out->state)
            {
            case FSM_ESC:
                if (c == '$')
                    out->state = FSM_ESCD;
                else if (c == '(')
                    out->state = FSM_ESCP;
                else
                    out->state = FSM_ASCII;
                break;

            case FSM_ESCD:
                if (c == '(')
                    out->state = FSM_ESCDP;
                else
                    out->state = FSM_NONASCII;
                break;

            case FSM_ESCDP:
                out->state = FSM_NONASCII;
                break;

            case FSM_ESCP:
                out->state = FSM_ASCII;
                break;

            case FSM_NONASCII:
                c &= 0x7F;
                break;

            case FSM_ASCII:
                break;
            }
        }

        PutByte(c, out);
    }
#endif /* NO_NATIVE_ISO2022_SUPPORT */

    else if ( out->encoding == UTF16LE ||
              out->encoding == UTF16BE ||
              out->encoding == UTF16 )
    {
        int i, numChars = 1;
        uint theChars[2];
        
        if ( !TY_(IsValidUTF16FromUCS4)(c) )
        {
            /* invalid UTF-16 value */
            numChars = 0;
        }
        else if ( TY_(IsCombinedChar)(c) )
        {
            /* output both, unless something goes wrong */
            numChars = 2;
            if ( !TY_(SplitSurrogatePair)(c, &theChars[0], &theChars[1]) )
            {
                numChars = 0;
            }
        }
        else
        {
            /* just put the char out */
            theChars[0] = c;
        }
        
        for (i = 0; i < numChars; i++)
        {
            c = theChars[i];
            
            if (out->encoding == UTF16LE)
            {
                uint ch = c & 0xFF; PutByte(ch, out); 
                ch = (c >> 8) & 0xFF; PutByte(ch, out); 
            }
    
            else if (out->encoding == UTF16BE || out->encoding == UTF16)
            {
                uint ch = (c >> 8) & 0xFF; PutByte(ch, out); 
                ch = c & 0xFF; PutByte(ch, out); 
            }
        }
    }
    else if (out->encoding == BIG5 || out->encoding == SHIFTJIS)
    {
        if (c < 128)
            PutByte(c, out);
        else
        {
            uint ch = (c >> 8) & 0xFF; PutByte(ch, out); 
            ch = c & 0xFF; PutByte(ch, out); 
        }
    }
    else
        PutByte( c, out );
}